

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<true,_true,_true>::doWalkFunction
          (SimplifyLocals<true,_true,_true> *this,Function *func)

{
  Function *func_00;
  bool bVar1;
  size_t sVar2;
  Module *module;
  ReFinalize local_180;
  Function *local_18;
  Function *func_local;
  SimplifyLocals<true,_true,_true> *this_local;
  
  local_18 = func;
  func_local = (Function *)this;
  sVar2 = Function::getNumLocals(func);
  if (sVar2 != 0) {
    LocalGetCounter::analyze(&this->getCounter,local_18);
    this->firstCycle = true;
    do {
      bVar1 = runMainOptimizations(this,local_18);
      this->anotherCycle = bVar1;
      if ((this->firstCycle & 1U) != 0) {
        this->firstCycle = false;
        this->anotherCycle = true;
      }
      if ((((this->anotherCycle & 1U) == 0) && (bVar1 = runLateOptimizations(this,local_18), bVar1))
         && (bVar1 = runMainOptimizations(this,local_18), bVar1)) {
        this->anotherCycle = true;
      }
    } while ((this->anotherCycle & 1U) != 0);
    if ((this->refinalize & 1U) != 0) {
      ReFinalize::ReFinalize(&local_180);
      func_00 = local_18;
      module = Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
               ::getModule((Walker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_true,_true>,_void>_>
                          );
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                (&local_180.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 func_00,module);
      ReFinalize::~ReFinalize(&local_180);
    }
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    if (func->getNumLocals() == 0) {
      return; // nothing to do
    }
    // scan local.gets
    getCounter.analyze(func);
    // multiple passes may be required per function, consider this:
    //    x = load
    //    y = store
    //    c(x, y)
    // the load cannot cross the store, but y can be sunk, after which so can x.
    //
    // we start with a cycle focusing on single-use locals, which are easy to
    // sink (we don't need to put a set), and a good match for common compiler
    // output patterns. further cycles do fully general sinking.
    firstCycle = true;
    do {
      anotherCycle = runMainOptimizations(func);
      // After the special first cycle, definitely do another.
      if (firstCycle) {
        firstCycle = false;
        anotherCycle = true;
      }
      // If we are all done, run the final optimizations, which may suggest we
      // can do more work.
      if (!anotherCycle) {
        // Don't run multiple cycles of just the final optimizations - in
        // particular, get canonicalization is not guaranteed to converge.
        // Instead, if final opts help then see if they enable main
        // opts; continue only if they do. In other words, do not end up
        // doing final opts again and again when no main opts are being
        // enabled.
        if (runLateOptimizations(func) && runMainOptimizations(func)) {
          anotherCycle = true;
        }
      }
    } while (anotherCycle);

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, this->getModule());
    }
  }